

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O1

Values * __thiscall
dynamicgraph::command::Value::valuesValue(Values *__return_storage_ptr__,Value *this)

{
  ExceptionAbstract *this_00;
  int local_44;
  string local_40;
  
  if (this->type_ == VALUES) {
    std::vector<dynamicgraph::command::Value,_std::allocator<dynamicgraph::command::Value>_>::vector
              (__return_storage_ptr__,
               (vector<dynamicgraph::command::Value,_std::allocator<dynamicgraph::command::Value>_>
                *)this->value_);
    return __return_storage_ptr__;
  }
  this_00 = (ExceptionAbstract *)__cxa_allocate_exception(0x30);
  local_44 = 700;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"value is not a vector of Value","");
  ExceptionAbstract::ExceptionAbstract(this_00,&local_44,&local_40);
  __cxa_throw(this_00,&ExceptionAbstract::typeinfo,ExceptionAbstract::~ExceptionAbstract);
}

Assistant:

Values Value::valuesValue() const {
  if (type_ == VALUES) return *((const Values *)value_);
  throw ExceptionAbstract(ExceptionAbstract::TOOLS,
                          "value is not a vector of Value");
}